

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall capnp::anon_unknown_79::Parser::parseValue(Parser *this,Builder *output)

{
  Input *this_00;
  byte *pbVar1;
  char *__src;
  undefined2 *puVar2;
  double dVar3;
  StructBuilder other;
  StructBuilder other_00;
  undefined8 uVar4;
  Orphan<capnp::json::Value> *pOVar5;
  RemoveConst<capnp::Orphan<capnp::json::Value>_> *pRVar6;
  Orphan<capnp::json::Value> *pOVar7;
  Builder *pBVar8;
  SegmentBuilder *pSVar9;
  byte bVar10;
  bool bVar11;
  char cVar12;
  BuilderArena *arena;
  CapTableBuilder *pCVar13;
  ulong uVar14;
  Exception *pEVar15;
  unsigned_long i;
  long lVar16;
  size_t sVar17;
  long lVar18;
  size_t __n;
  long lVar19;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> expected_01;
  Reader value;
  Reader value_00;
  Fault f;
  Vector<capnp::Orphan<capnp::json::Value>_> values;
  Orphan<capnp::json::Value> orphan;
  Builder array;
  undefined1 local_118 [48];
  Vector<capnp::Orphan<capnp::json::Value>_> local_e8;
  Builder *local_c0;
  StructBuilder local_b8;
  PointerBuilder local_88;
  undefined1 local_68 [24];
  word *pwStack_50;
  CapTableBuilder *local_40;
  BuilderArena *local_38;
  
  this_00 = &this->input;
  local_c0 = output;
  Input::consumeWhitespace(this_00);
  if (((this->input).wrapped.size_ == 0) || (*(this_00->wrapped).ptr == '\0')) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              ((Fault *)local_118,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x27a,FAILED,"!input.exhausted()","\"JSON message ends prematurely.\"",
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal((Fault *)local_118);
  }
  bVar10 = Input::nextChar(this_00);
  if (bVar10 < 0x5b) {
    if (9 < bVar10 - 0x30) {
      if (bVar10 == 0x22) {
        consumeQuotedString((String *)&local_b8,this);
        pEVar15 = (Exception *)local_b8.segment;
        if ((SegmentBuilder *)local_b8.capTable == (SegmentBuilder *)0x0) {
          pEVar15 = (Exception *)0x515344;
        }
        value_00.super_StringPtr.content.size_ =
             (long)&((SegmentReader *)&(local_b8.capTable)->super_CapTableReader)->arena +
             (ulong)((SegmentBuilder *)local_b8.capTable == (SegmentBuilder *)0x0);
        *(undefined2 *)(local_c0->_builder).data = 3;
        local_118._0_8_ = (local_c0->_builder).segment;
        local_118._8_8_ = (local_c0->_builder).capTable;
        local_118._16_8_ = (local_c0->_builder).pointers;
        value_00.super_StringPtr.content.ptr = (char *)pEVar15;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_118,value_00);
        pCVar13 = local_b8.capTable;
        pSVar9 = local_b8.segment;
        if ((Exception *)local_b8.segment != (Exception *)0x0) {
          local_b8.segment = (SegmentBuilder *)0x0;
          local_b8.capTable = (CapTableBuilder *)0x0;
          (**(code **)*local_b8.data)(local_b8.data,pSVar9,1,pCVar13,pCVar13,0);
        }
        goto LAB_00397767;
      }
      if (bVar10 != 0x2d) goto LAB_00398100;
    }
    __src = (this_00->wrapped).ptr;
    Input::tryConsume(this_00,'-');
    bVar11 = Input::tryConsume(this_00,'0');
    if (!bVar11) {
      cVar12 = Input::nextChar(this_00);
      if (8 < (byte)(cVar12 - 0x31U)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x24a,FAILED,"predicate(current)","\"Unexpected input in JSON message.\"",
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      Input::advance(this_00,1);
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    bVar11 = Input::tryConsume(this_00,'.');
    if (bVar11) {
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    bVar11 = Input::tryConsume(this_00,'e');
    if ((bVar11) || (bVar11 = Input::tryConsume(this_00,'E'), bVar11)) {
      bVar11 = Input::tryConsume(this_00,'+');
      if (!bVar11) {
        Input::tryConsume(this_00,'-');
      }
      while ((((this->input).wrapped.size_ != 0 && (*(this_00->wrapped).ptr != '\0')) &&
             (cVar12 = Input::nextChar(this_00), (byte)(cVar12 - 0x30U) < 10))) {
        Input::advance(this_00,1);
      }
    }
    __n = (long)(this_00->wrapped).ptr - (long)__src;
    if (__n == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                ((Fault *)local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x321,FAILED,"numArrayPtr.size() > 0","\"Expected number in JSON input.\"",
                 (char (*) [31])"Expected number in JSON input.");
      kj::_::Debug::Fault::fatal((Fault *)local_118);
    }
    local_118._0_8_ = (Exception *)0x0;
    local_118._8_8_ = (CapTableBuilder *)0x0;
    local_118._16_8_ = (Exception *)0x0;
    if (__n != 0) {
      sVar17 = 4;
      if (4 < __n) {
        sVar17 = __n;
      }
      kj::Vector<char>::setCapacity((Vector<char> *)local_118,sVar17);
    }
    uVar4 = local_118._8_8_;
    memcpy((void *)local_118._8_8_,__src,__n);
    local_118._8_8_ = uVar4 + __n;
    if (local_118._8_8_ == local_118._16_8_) {
      sVar17 = 4;
      if (local_118._16_8_ != local_118._0_8_) {
        sVar17 = (local_118._16_8_ - local_118._0_8_) * 2;
      }
      kj::Vector<char>::setCapacity((Vector<char> *)local_118,sVar17);
    }
    *(char *)&((SegmentReader *)local_118._8_8_)->arena = '\0';
    local_118._8_8_ = (long)&((SegmentReader *)local_118._8_8_)->arena + 1;
    if (local_118._8_8_ != local_118._16_8_) {
      kj::Vector<char>::setCapacity((Vector<char> *)local_118,local_118._8_8_ - local_118._0_8_);
    }
    local_b8.segment = (SegmentBuilder *)local_118._0_8_;
    local_b8.capTable = (CapTableBuilder *)(local_118._8_8_ - local_118._0_8_);
    local_b8.data = (void *)local_118._24_8_;
    pEVar15 = (Exception *)0x515344;
    if ((SegmentBuilder *)local_b8.capTable != (SegmentBuilder *)0x0) {
      pEVar15 = (Exception *)local_118._0_8_;
    }
    local_118._8_8_ =
         (long)&(((SegmentBuilder *)local_b8.capTable)->super_SegmentReader).arena +
         (ulong)((SegmentBuilder *)local_b8.capTable == (SegmentBuilder *)0x0);
    local_118._0_8_ = pEVar15;
    dVar3 = kj::StringPtr::parseAs<double>((StringPtr *)local_118);
    pCVar13 = local_b8.capTable;
    pSVar9 = local_b8.segment;
    puVar2 = (undefined2 *)(local_c0->_builder).data;
    *puVar2 = 2;
    *(double *)(puVar2 + 4) = dVar3;
    if ((Exception *)local_b8.segment != (Exception *)0x0) {
      local_b8.segment = (SegmentBuilder *)0x0;
      local_b8.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_b8.data)(local_b8.data,pSVar9,1,pCVar13,pCVar13,0);
    }
  }
  else if (bVar10 < 0x6e) {
    if (bVar10 == 0x5b) {
      local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
      local_118._32_4_ = (local_c0->_builder).dataSize;
      local_118._36_2_ = (local_c0->_builder).pointerCount;
      local_118[0x26] = (local_c0->_builder).field_0x26;
      local_118[0x27] = (local_c0->_builder).field_0x27;
      local_118._0_8_ = (local_c0->_builder).segment;
      local_118._8_8_ = (local_c0->_builder).capTable;
      local_118._16_8_ = (local_c0->_builder).data;
      local_118._24_8_ = (local_c0->_builder).pointers;
      arena = capnp::_::StructBuilder::getArena((StructBuilder *)local_118);
      pCVar13 = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_118);
      Input::consume(this_00,'[');
      uVar14 = this->nestingDepth + 1;
      this->nestingDepth = uVar14;
      if (this->maxNestingDepth < uVar14) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x29b,FAILED,"++nestingDepth <= maxNestingDepth",
                   "\"JSON message nested too deeply.\"",
                   (char (*) [32])"JSON message nested too deeply.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      bVar11 = false;
      while( true ) {
        Input::consumeWhitespace(this_00);
        cVar12 = Input::nextChar(this_00);
        pBVar8 = local_c0;
        if (cVar12 == ']') break;
        capnp::_::OrphanBuilder::initStruct
                  ((OrphanBuilder *)local_118,arena,pCVar13,(StructSize)0x10002);
        local_b8.data = (void *)local_118._16_8_;
        local_b8.pointers = (WirePointer *)local_118._24_8_;
        local_b8.segment = (SegmentBuilder *)local_118._0_8_;
        local_b8.capTable = (CapTableBuilder *)local_118._8_8_;
        capnp::_::OrphanBuilder::asStruct
                  ((StructBuilder *)local_118,(OrphanBuilder *)&local_b8,(StructSize)0x10002);
        if (bVar11) {
          Input::consumeWhitespace(this_00);
          Input::consume(this_00,',');
          Input::consumeWhitespace(this_00);
        }
        parseValue(this,(Builder *)local_118);
        if (local_e8.builder.pos == local_e8.builder.endPtr) {
          sVar17 = (long)local_e8.builder.endPtr - (long)local_e8.builder.ptr >> 4;
          if (local_e8.builder.endPtr == local_e8.builder.ptr) {
            sVar17 = 4;
          }
          kj::Vector<capnp::Orphan<capnp::json::Value>_>::setCapacity(&local_e8,sVar17);
        }
        ((local_e8.builder.pos)->builder).segment = (SegmentBuilder *)local_b8.capTable;
        ((local_e8.builder.pos)->builder).capTable = (CapTableBuilder *)local_b8.data;
        ((local_e8.builder.pos)->builder).location = (word *)local_b8.pointers;
        ((local_e8.builder.pos)->builder).tag.content = (uint64_t)local_b8.segment;
        local_b8.pointers = (WirePointer *)0x0;
        local_e8.builder.pos = local_e8.builder.pos + 1;
        bVar11 = true;
      }
      *(undefined2 *)(local_c0->_builder).data = 4;
      local_b8.segment = (local_c0->_builder).segment;
      local_b8.capTable = (local_c0->_builder).capTable;
      local_b8.data = (local_c0->_builder).pointers;
      capnp::_::PointerBuilder::initStructList
                ((ListBuilder *)local_118,(PointerBuilder *)&local_b8,
                 (ElementCount)
                 ((ulong)((long)local_e8.builder.pos - (long)local_e8.builder.ptr) >> 5),
                 (StructSize)0x10002);
      local_118._0_8_ = (pBVar8->_builder).segment;
      local_118._8_8_ = (pBVar8->_builder).capTable;
      local_118._16_8_ = (pBVar8->_builder).pointers;
      capnp::_::PointerBuilder::getStructList
                ((ListBuilder *)local_68,(PointerBuilder *)local_118,(StructSize)0x10002,(word *)0x0
                );
      lVar18 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr;
      if (lVar18 != 0) {
        lVar19 = 0;
        lVar16 = 0;
        do {
          pOVar5 = local_e8.builder.ptr;
          capnp::_::ListBuilder::getStructElement
                    ((StructBuilder *)local_118,(ListBuilder *)local_68,(ElementCount)lVar16);
          capnp::_::OrphanBuilder::asStruct
                    (&local_b8,(OrphanBuilder *)((long)&(pOVar5->builder).tag.content + lVar19),
                     (StructSize)0x0);
          other.capTable = local_b8.capTable;
          other.segment = local_b8.segment;
          other.data = local_b8.data;
          other.pointers = local_b8.pointers;
          other.dataSize = local_b8.dataSize;
          other.pointerCount = local_b8.pointerCount;
          other._38_2_ = local_b8._38_2_;
          capnp::_::StructBuilder::transferContentFrom((StructBuilder *)local_118,other);
          lVar16 = lVar16 + 1;
          lVar19 = lVar19 + 0x20;
        } while (lVar18 >> 5 != lVar16);
      }
      Input::consume(this_00,']');
      pOVar7 = local_e8.builder.endPtr;
      pRVar6 = local_e8.builder.pos;
      pOVar5 = local_e8.builder.ptr;
      this->nestingDepth = this->nestingDepth - 1;
      if (local_e8.builder.ptr != (Orphan<capnp::json::Value> *)0x0) {
        local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
        local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
        local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
        (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
                  (local_e8.builder.disposer,pOVar5,0x20,(long)pRVar6 - (long)pOVar5 >> 5,
                   (long)pOVar7 - (long)pOVar5 >> 5,
                   kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value>,_false>::destruct);
      }
    }
    else {
      if (bVar10 != 0x66) {
LAB_00398100:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
                  ((Fault *)local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                   ,0x286,FAILED,(char *)0x0,"\"Unexpected input in JSON message.\"",
                   (char (*) [34])"Unexpected input in JSON message.");
        kj::_::Debug::Fault::fatal((Fault *)local_118);
      }
      expected_00.size_ = 5;
      expected_00.ptr = "false";
      Input::consume(this_00,expected_00);
      puVar2 = (undefined2 *)(local_c0->_builder).data;
      *puVar2 = 1;
      pbVar1 = (byte *)(puVar2 + 1);
      *pbVar1 = *pbVar1 & 0xfe;
    }
  }
  else if (bVar10 == 0x7b) {
    local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
    local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
    local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
    local_118._32_4_ = (local_c0->_builder).dataSize;
    local_118._36_2_ = (local_c0->_builder).pointerCount;
    local_118[0x26] = (local_c0->_builder).field_0x26;
    local_118[0x27] = (local_c0->_builder).field_0x27;
    local_118._0_8_ = (local_c0->_builder).segment;
    local_118._8_8_ = (local_c0->_builder).capTable;
    local_118._16_8_ = (local_c0->_builder).data;
    local_118._24_8_ = (local_c0->_builder).pointers;
    local_38 = capnp::_::StructBuilder::getArena((StructBuilder *)local_118);
    local_40 = capnp::_::StructBuilder::getCapTable((StructBuilder *)local_118);
    Input::consume(this_00,'{');
    uVar14 = this->nestingDepth + 1;
    this->nestingDepth = uVar14;
    if (this->maxNestingDepth < uVar14) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)local_118,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x2be,FAILED,"++nestingDepth <= maxNestingDepth",
                 "\"JSON message nested too deeply.\"",
                 (char (*) [32])"JSON message nested too deeply.");
      kj::_::Debug::Fault::fatal((Fault *)local_118);
    }
    bVar11 = false;
    while( true ) {
      Input::consumeWhitespace(this_00);
      cVar12 = Input::nextChar(this_00);
      pBVar8 = local_c0;
      if (cVar12 == '}') break;
      capnp::_::OrphanBuilder::initStruct
                ((OrphanBuilder *)local_118,local_38,local_40,(StructSize)0x20000);
      local_68._16_8_ = local_118._16_8_;
      pwStack_50 = (word *)local_118._24_8_;
      local_68._0_8_ = local_118._0_8_;
      local_68._8_8_ = local_118._8_8_;
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_118,(OrphanBuilder *)local_68,(StructSize)0x20000);
      if (bVar11) {
        Input::consumeWhitespace(this_00);
        Input::consume(this_00,',');
        Input::consumeWhitespace(this_00);
      }
      consumeQuotedString((String *)&local_88,this);
      pEVar15 = (Exception *)0x515344;
      if ((SegmentBuilder *)local_88.capTable != (SegmentBuilder *)0x0) {
        pEVar15 = (Exception *)local_88.segment;
      }
      value.super_StringPtr.content.size_ =
           (long)&((SegmentReader *)&(local_88.capTable)->super_CapTableReader)->arena +
           (ulong)((SegmentBuilder *)local_88.capTable == (SegmentBuilder *)0x0);
      local_b8.segment = (SegmentBuilder *)local_118._0_8_;
      local_b8.capTable = (CapTableBuilder *)local_118._8_8_;
      local_b8.data = (void *)local_118._24_8_;
      value.super_StringPtr.content.ptr = (char *)pEVar15;
      capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_b8,value);
      pCVar13 = local_88.capTable;
      pSVar9 = local_88.segment;
      if ((Exception *)local_88.segment != (Exception *)0x0) {
        local_88.segment = (SegmentBuilder *)0x0;
        local_88.capTable = (CapTableBuilder *)0x0;
        (**(code **)*local_88.pointer)(local_88.pointer,pSVar9,1,pCVar13,pCVar13,0);
      }
      Input::consumeWhitespace(this_00);
      Input::consume(this_00,':');
      Input::consumeWhitespace(this_00);
      local_88.pointer = (WirePointer *)(local_118._24_8_ + 8);
      local_88.segment = (SegmentBuilder *)local_118._0_8_;
      local_88.capTable = (CapTableBuilder *)local_118._8_8_;
      capnp::_::PointerBuilder::getStruct(&local_b8,&local_88,(StructSize)0x10002,(word *)0x0);
      parseValue(this,(Builder *)&local_b8);
      if (local_e8.builder.pos == local_e8.builder.endPtr) {
        sVar17 = (long)local_e8.builder.endPtr - (long)local_e8.builder.ptr >> 4;
        if (local_e8.builder.endPtr == local_e8.builder.ptr) {
          sVar17 = 4;
        }
        kj::Vector<capnp::Orphan<capnp::json::Value::Field>_>::setCapacity
                  ((Vector<capnp::Orphan<capnp::json::Value::Field>_> *)&local_e8,sVar17);
      }
      ((local_e8.builder.pos)->builder).segment = (SegmentBuilder *)local_68._8_8_;
      ((local_e8.builder.pos)->builder).capTable = (CapTableBuilder *)local_68._16_8_;
      ((local_e8.builder.pos)->builder).location = pwStack_50;
      ((local_e8.builder.pos)->builder).tag.content = local_68._0_8_;
      pwStack_50 = (word *)0x0;
      local_e8.builder.pos = local_e8.builder.pos + 1;
      bVar11 = true;
    }
    *(undefined2 *)(local_c0->_builder).data = 5;
    local_b8.segment = (local_c0->_builder).segment;
    local_b8.capTable = (local_c0->_builder).capTable;
    local_b8.data = (local_c0->_builder).pointers;
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)local_118,(PointerBuilder *)&local_b8,
               (ElementCount)((ulong)((long)local_e8.builder.pos - (long)local_e8.builder.ptr) >> 5)
               ,(StructSize)0x20000);
    local_118._0_8_ = (pBVar8->_builder).segment;
    local_118._8_8_ = (pBVar8->_builder).capTable;
    local_118._16_8_ = (pBVar8->_builder).pointers;
    capnp::_::PointerBuilder::getStructList
              ((ListBuilder *)local_68,(PointerBuilder *)local_118,(StructSize)0x20000,(word *)0x0);
    lVar18 = (long)local_e8.builder.pos - (long)local_e8.builder.ptr;
    if (lVar18 != 0) {
      lVar19 = 0;
      lVar16 = 0;
      do {
        pOVar5 = local_e8.builder.ptr;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)local_118,(ListBuilder *)local_68,(ElementCount)lVar16);
        capnp::_::OrphanBuilder::asStruct
                  (&local_b8,(OrphanBuilder *)((long)&(pOVar5->builder).tag.content + lVar19),
                   (StructSize)0x0);
        other_00.capTable = local_b8.capTable;
        other_00.segment = local_b8.segment;
        other_00.data = local_b8.data;
        other_00.pointers = local_b8.pointers;
        other_00.dataSize = local_b8.dataSize;
        other_00.pointerCount = local_b8.pointerCount;
        other_00._38_2_ = local_b8._38_2_;
        capnp::_::StructBuilder::transferContentFrom((StructBuilder *)local_118,other_00);
        lVar16 = lVar16 + 1;
        lVar19 = lVar19 + 0x20;
      } while (lVar18 >> 5 != lVar16);
    }
    Input::consume(this_00,'}');
    pOVar7 = local_e8.builder.endPtr;
    pRVar6 = local_e8.builder.pos;
    pOVar5 = local_e8.builder.ptr;
    this->nestingDepth = this->nestingDepth - 1;
    if (local_e8.builder.ptr != (Orphan<capnp::json::Value> *)0x0) {
      local_e8.builder.ptr = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.pos = (Orphan<capnp::json::Value> *)0x0;
      local_e8.builder.endPtr = (Orphan<capnp::json::Value> *)0x0;
      (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
                (local_e8.builder.disposer,pOVar5,0x20,(long)pRVar6 - (long)pOVar5 >> 5,
                 (long)pOVar7 - (long)pOVar5 >> 5,
                 kj::ArrayDisposer::Dispose_<capnp::Orphan<capnp::json::Value::Field>,_false>::
                 destruct);
    }
  }
  else if (bVar10 == 0x74) {
    expected_01.size_ = 4;
    expected_01.ptr = "true";
    Input::consume(this_00,expected_01);
    puVar2 = (undefined2 *)(local_c0->_builder).data;
    *puVar2 = 1;
    pbVar1 = (byte *)(puVar2 + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  else {
    if (bVar10 != 0x6e) goto LAB_00398100;
    expected.size_ = 4;
    expected.ptr = "null";
    Input::consume(this_00,expected);
    *(undefined2 *)(local_c0->_builder).data = 0;
  }
LAB_00397767:
  Input::consumeWhitespace(this_00);
  return;
}

Assistant:

void parseValue(JsonValue::Builder& output) {
    input.consumeWhitespace();
    KJ_DEFER(input.consumeWhitespace());

    KJ_REQUIRE(!input.exhausted(), "JSON message ends prematurely.");

    switch (input.nextChar()) {
      case 'n': input.consume(kj::StringPtr("null"));  output.setNull();         break;
      case 'f': input.consume(kj::StringPtr("false")); output.setBoolean(false); break;
      case 't': input.consume(kj::StringPtr("true"));  output.setBoolean(true);  break;
      case '"': parseString(output); break;
      case '[': parseArray(output);  break;
      case '{': parseObject(output); break;
      case '-': case '0': case '1': case '2': case '3':
      case '4': case '5': case '6': case '7': case '8':
      case '9': parseNumber(output); break;
      default: KJ_FAIL_REQUIRE("Unexpected input in JSON message.");
    }
  }